

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void * buffer_insert_raw(BUFFER *buf,size_t off,size_t n)

{
  int iVar1;
  size_t __n;
  void *__src;
  
  if ((buf->alloc < buf->size + n) && (iVar1 = buffer_reserve(buf,n), iVar1 != 0)) {
    return (void *)0x0;
  }
  __n = buf->size - off;
  if (off <= buf->size && __n != 0) {
    __src = (void *)((long)buf->data + off);
    memmove((void *)((long)__src + n),__src,__n);
  }
  buf->size = buf->size + n;
  return (void *)(off + (long)buf->data);
}

Assistant:

void*
buffer_insert_raw(BUFFER* buf, size_t off, size_t n)
{
    if(buf->size + n > buf->alloc) {
        if(buffer_reserve(buf, n) != 0)
            return NULL;
    }

    if(buf->size > off)
        memmove((uint8_t*)buf->data + off + n, (uint8_t*)buf->data + off, buf->size - off);

    buf->size += n;
    return buffer_data_at(buf, off);
}